

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

CVConstIterator * slang::end(CVConstIterator *__return_storage_ptr__,ConstantValue *cv)

{
  Variant *__variants;
  anon_class_1_0_00000001 local_19;
  ConstantValue *local_18;
  ConstantValue *cv_local;
  
  local_18 = cv;
  cv_local = (ConstantValue *)__return_storage_ptr__;
  __variants = ConstantValue::getVariant_abi_cxx11_(cv);
  std::
  visit<slang::end(slang::ConstantValue_const&)::__0,std::variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>const&>
            (__return_storage_ptr__,&local_19,__variants);
  return __return_storage_ptr__;
}

Assistant:

CVConstIterator end(const ConstantValue& cv) {
    return std::visit(
        [](auto&& arg) -> CVConstIterator {
            using T = std::decay_t<decltype(arg)>;
            if constexpr (std::is_same_v<T, ConstantValue::Elements>) {
                return arg.end();
            }
            else if constexpr (std::is_same_v<T, ConstantValue::Map> ||
                               std::is_same_v<T, ConstantValue::Queue>) {
                return arg->end();
            }
            else {
                ASSUME_UNREACHABLE;
            }
        },
        cv.getVariant());
}